

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O0

void qDrawWinPanel(QPainter *p,QRect *r,QPalette *pal,bool sunken,QBrush *fill)

{
  bool in_stack_0000001f;
  QPalette *in_stack_00000020;
  int in_stack_00000028;
  int in_stack_0000002c;
  undefined7 in_stack_00000038;
  QBrush *in_stack_00000058;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  
  QRect::x((QRect *)0x3fa8d8);
  QRect::y((QRect *)0x3fa8e6);
  QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  qDrawWinPanel((QPainter *)CONCAT17(sunken,in_stack_00000038),fill._4_4_,(int)fill,
                in_stack_0000002c,in_stack_00000028,in_stack_00000020,in_stack_0000001f,
                in_stack_00000058);
  return;
}

Assistant:

void qDrawWinPanel(QPainter *p, const QRect &r,
                    const QPalette &pal, bool sunken, const QBrush *fill)
{
    qDrawWinPanel(p, r.x(), r.y(), r.width(), r.height(), pal, sunken, fill);
}